

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall
fmt::v11::detail::buffer<wchar_t>::append<wchar_t>
          (buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  wchar_t *pwVar1;
  make_unsigned_t<long> mVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (; begin != end; begin = begin + uVar5) {
    mVar2 = to_unsigned<long>((long)end - (long)begin >> 2);
    sVar3 = this->size_;
    uVar4 = this->capacity_;
    if (uVar4 < sVar3 + mVar2) {
      (*this->grow_)(this,sVar3 + mVar2);
      sVar3 = this->size_;
      uVar4 = this->capacity_;
    }
    uVar5 = uVar4 - sVar3;
    if (mVar2 <= uVar4 - sVar3) {
      uVar5 = mVar2;
    }
    pwVar1 = this->ptr_;
    for (mVar2 = 0; uVar5 != mVar2; mVar2 = mVar2 + 1) {
      pwVar1[sVar3 + mVar2] = begin[mVar2];
    }
    this->size_ = sVar3 + uVar5;
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }